

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trampoline.c
# Opt level: O0

undefined1 * create_trampoline(void *ctx,undefined1 *routine)

{
  int iVar1;
  undefined8 *addr;
  void **map;
  uintptr_t trampoline_sz;
  undefined1 *routine_local;
  void *ctx_local;
  
  addr = (undefined8 *)mmap((void *)0x0,0x1000,3,0x22,-1,0);
  if (addr == (undefined8 *)0xffffffffffffffff) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/src/trampoline.c"
                ,0x52,"map != MAP_FAILED");
    mmk_abort();
  }
  *addr = ctx;
  addr[1] = routine;
  memcpy(addr + 2,mmk_trampoline,0xeb);
  iVar1 = mmk_mprotect(addr,0x1000,5);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/src/trampoline.c"
                ,0x57,"!mmk_mprotect(map, PAGE_SIZE, PROT_READ | PROT_EXEC)");
    mmk_abort();
  }
  __clear_cache(addr,addr + 0x1000);
  return (undefined1 *)(addr + 2);
}

Assistant:

plt_fn *create_trampoline(void *ctx, plt_fn *routine)
{
    uintptr_t trampoline_sz = (uintptr_t) mmk_trampoline_end
                            - (uintptr_t) mmk_trampoline;

    mmk_assert(trampoline_sz < PAGE_SIZE);

# if defined HAVE_MMAP_MAP_ANONYMOUS
#  if !defined MAP_JIT
#   define MAP_JIT 0
#  endif
    void **map = mmap(NULL, PAGE_SIZE,
            PROT_READ | PROT_WRITE,
            MAP_PRIVATE | MAP_ANONYMOUS | MAP_JIT,
            -1, 0);
# elif defined HAVE_MMAP_MAP_ANON
    void **map = mmap(NULL, PAGE_SIZE,
            PROT_READ | PROT_WRITE,
            MAP_PRIVATE | MAP_ANON,
            -1, 0);
# else
    int fd = open("/dev/zero", O_RDWR);
    mmk_assert(fd != -1);

    void **map = mmap(NULL, PAGE_SIZE,
            PROT_READ | PROT_WRITE | PROT_EXEC,
            MAP_PRIVATE,
            fd, 0);

    mmk_assert(close(fd) != -1);
# endif

    mmk_assert(map != MAP_FAILED);

    *map = ctx;
    *(map + 1) = (void *) routine;
    memcpy(map + 2, mmk_trampoline, trampoline_sz);
    mmk_assert(!mmk_mprotect(map, PAGE_SIZE, PROT_READ | PROT_EXEC));
# if defined __APPLE__
    sys_icache_invalidate(map, PAGE_SIZE);
# elif defined __clang__  // Check for Clang first, it may set __GNUC__ too.
    __clear_cache(map, map + PAGE_SIZE);
# elif defined __GNUC__
    __builtin___clear_cache((char *)map, (char *)(map + PAGE_SIZE));
# endif
    return (plt_fn *) (map + 2);
}